

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::to_short_string(string *in,size_t max_len,char *out)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  ulong in_RDI;
  size_t i;
  undefined1 local_31;
  undefined8 local_20;
  
  lVar1 = CONCAT71(in_register_00000011,in_DL);
  local_20 = 0;
  do {
    if (in_RSI <= local_20) {
      uVar2 = std::__cxx11::string::length();
      if (in_RSI < uVar2) {
        *(undefined1 *)(lVar1 + (in_RSI - 2)) = 0x2e;
        *(undefined1 *)(lVar1 + (in_RSI - 1)) = 0x2e;
      }
      *(undefined1 *)(lVar1 + in_RSI) = 0;
      return;
    }
    uVar2 = std::__cxx11::string::length();
    if (local_20 < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (*pcVar3 == '\n') goto LAB_0039cc30;
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (*pcVar3 == '\t') goto LAB_0039cc30;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
      local_31 = *puVar4;
    }
    else {
LAB_0039cc30:
      local_31 = 0x20;
    }
    *(undefined1 *)(lVar1 + local_20) = local_31;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void to_short_string(string in, size_t max_len, char* out)
{
  for (size_t i = 0; i < max_len; i++)
    out[i] = ((i >= in.length()) || (in[i] == '\n') || (in[i] == '\t')) ? ' ' : in[i];

  if (in.length() > max_len)
  {
    out[max_len - 2] = '.';
    out[max_len - 1] = '.';
  }
  out[max_len] = 0;
}